

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

errr finish_parse_pit(parser *p)

{
  ushort uVar1;
  pit_profile *ppVar2;
  wchar_t wVar3;
  wchar_t local_24;
  wchar_t pit_idx;
  pit_profile *n;
  pit_profile *pit;
  parser *p_local;
  
  z_info->pit_max = 0;
  for (n = (pit_profile *)parser_priv(p); n != (pit_profile *)0x0; n = n->next) {
    z_info->pit_max = z_info->pit_max + 1;
  }
  pit_info = (pit_profile *)mem_zalloc((long)(int)(z_info->pit_max + 1) * 0x78);
  uVar1 = z_info->pit_max;
  n = (pit_profile *)parser_priv(p);
  wVar3 = (uint)uVar1;
  while( true ) {
    local_24 = wVar3 + L'\xffffffff';
    if (n == (pit_profile *)0x0) {
      z_info->pit_max = z_info->pit_max + 1;
      parser_destroy(p);
      return 0;
    }
    if (local_24 < L'\0') break;
    memcpy(pit_info + local_24,n,0x78);
    pit_info[local_24].pit_idx = local_24;
    ppVar2 = n->next;
    if (local_24 < (uint)z_info->pit_max + L'\xffffffff') {
      pit_info[local_24].next = pit_info + wVar3;
    }
    else {
      pit_info[local_24].next = (pit_profile *)0x0;
    }
    mem_free(n);
    n = ppVar2;
    wVar3 = local_24;
  }
  __assert_fail("pit_idx >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x9be,"errr finish_parse_pit(struct parser *)");
}

Assistant:

static errr finish_parse_pit(struct parser *p) {
	struct pit_profile *pit, *n;
	int pit_idx;
		
	/* Scan the list for the max id */
	z_info->pit_max = 0;
	pit = parser_priv(p);
	while (pit) {
		z_info->pit_max++;
		pit = pit->next;
	}

	/* Allocate the direct access list and copy the data to it */
	pit_info = mem_zalloc((z_info->pit_max + 1) * sizeof(*pit));
	pit_idx = z_info->pit_max - 1;
	for (pit = parser_priv(p); pit; pit = n, pit_idx--) {
		assert(pit_idx >= 0);

		memcpy(&pit_info[pit_idx], pit, sizeof(*pit));
		pit_info[pit_idx].pit_idx = pit_idx;
		n = pit->next;
		if (pit_idx < z_info->pit_max - 1)
			pit_info[pit_idx].next = &pit_info[pit_idx + 1];
		else
			pit_info[pit_idx].next = NULL;

		mem_free(pit);
	}
	z_info->pit_max += 1;

	parser_destroy(p);
	return 0;
}